

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O0

EStatusCode __thiscall
PDFDocumentHandler::ScanStreamForResourcesTokens
          (PDFDocumentHandler *this,PDFStreamInput *inSourceStream,
          StringToStringMap *inMappedResourcesNames,ResourceTokenMarkerList *outResourceMarkers)

{
  IByteReaderWithPosition *pIVar1;
  byte bVar2;
  LongFilePositionType LVar3;
  char *pcVar4;
  bool local_169;
  string local_140;
  ResourceTokenMarker local_120;
  _Self local_f8;
  byte local_e9;
  key_type local_e8;
  _Self local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  BoolAndString tokenizerResult_1;
  BoolAndString tokenizerResult;
  undefined1 local_58 [8];
  SimpleStringTokenizer tokenizer;
  IByteReader *streamReader;
  ResourceTokenMarkerList *outResourceMarkers_local;
  StringToStringMap *inMappedResourcesNames_local;
  PDFStreamInput *inSourceStream_local;
  PDFDocumentHandler *this_local;
  
  tokenizer.mRecentTokenPosition =
       (LongFilePositionType)PDFParser::CreateInputStreamReader(this->mParser,inSourceStream);
  if ((IByteReader *)tokenizer.mRecentTokenPosition == (IByteReader *)0x0) {
    this_local._4_4_ = eFailure;
  }
  else {
    pIVar1 = this->mPDFStream;
    LVar3 = PDFStreamInput::GetStreamContentStart(inSourceStream);
    (*(pIVar1->super_IByteReader)._vptr_IByteReader[4])(pIVar1,LVar3);
    SimpleStringTokenizer::SimpleStringTokenizer((SimpleStringTokenizer *)local_58);
    SimpleStringTokenizer::SetReadStream
              ((SimpleStringTokenizer *)local_58,(IByteReader *)tokenizer.mRecentTokenPosition);
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&tokenizerResult_1.second.field_2 + 8));
    do {
      bVar2 = (**(code **)(*(long *)tokenizer.mRecentTokenPosition + 0x18))();
      if ((bVar2 & 1) == 0) break;
      SimpleStringTokenizer::GetNextToken_abi_cxx11_
                ((BoolAndString *)local_b8,(SimpleStringTokenizer *)local_58);
      if ((local_b8[0] & 1U) == 0) {
        local_bc = 3;
      }
      else {
        local_e9 = 0;
        pcVar4 = (char *)std::__cxx11::string::at((ulong)&tokenizerResult_1);
        local_169 = false;
        if (*pcVar4 == '/') {
          std::__cxx11::string::substr((ulong)&local_e8,(ulong)&tokenizerResult_1);
          local_e9 = 1;
          local_c8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(inMappedResourcesNames,&local_e8);
          local_f8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(inMappedResourcesNames);
          local_169 = std::operator!=(&local_c8,&local_f8);
        }
        if ((local_e9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_e8);
        }
        if (local_169 != false) {
          std::__cxx11::string::substr((ulong)&local_140,(ulong)&tokenizerResult_1);
          LVar3 = SimpleStringTokenizer::GetRecentTokenPosition((SimpleStringTokenizer *)local_58);
          ResourceTokenMarker::ResourceTokenMarker(&local_120,&local_140,LVar3);
          std::__cxx11::list<ResourceTokenMarker,_std::allocator<ResourceTokenMarker>_>::push_back
                    (outResourceMarkers,&local_120);
          ResourceTokenMarker::~ResourceTokenMarker(&local_120);
          std::__cxx11::string::~string((string *)&local_140);
        }
        local_bc = 0;
      }
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_b8);
    } while (local_bc == 0);
    if (tokenizer.mRecentTokenPosition != 0) {
      (**(code **)(*(long *)tokenizer.mRecentTokenPosition + 8))();
    }
    this_local._4_4_ = eSuccess;
    local_bc = 1;
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)((long)&tokenizerResult_1.second.field_2 + 8));
    SimpleStringTokenizer::~SimpleStringTokenizer((SimpleStringTokenizer *)local_58);
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode PDFDocumentHandler::ScanStreamForResourcesTokens(PDFStreamInput* inSourceStream,const StringToStringMap& inMappedResourcesNames,ResourceTokenMarkerList& outResourceMarkers)
{
	IByteReader* streamReader = mParser->CreateInputStreamReader(inSourceStream);

	if(!streamReader)
		return PDFHummus::eFailure;

	mPDFStream->SetPosition(inSourceStream->GetStreamContentStart());

	// using simplestringtokenizer instead of regular pdfparsertokenizer, as content stream may contain
	// streams, which may have tokens that will be interpreted as pdf tokens (like string start), and so will cause
	// a wrong inclusion of content and so will skip content that should be replaced.
	// There's still risk here, in that there will be a string that like a resource name with forward slash which will be mistaken
	// for a resource usage. this is something to tackle still.
	SimpleStringTokenizer tokenizer;
	tokenizer.SetReadStream(streamReader);

	BoolAndString tokenizerResult;

	while(streamReader->NotEnded())
	{
		BoolAndString tokenizerResult = tokenizer.GetNextToken();

		if(!tokenizerResult.first)
			break;

		// check if this is a token that will need replacement - 1. verify that it's a name 2. verify that it's a name in the input map
		// note that here i don't have to take care of name space chars encoding, as the names are alrady encoded in the map [the new names are never containing space chars]
		if(tokenizerResult.second.at(0) == scSlash && 
			(inMappedResourcesNames.find(tokenizerResult.second.substr(1)) != inMappedResourcesNames.end()))
				outResourceMarkers.push_back(ResourceTokenMarker(tokenizerResult.second.substr(1),tokenizer.GetRecentTokenPosition()));
	}

	delete streamReader;
	return PDFHummus::eSuccess;
}